

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  uint uVar1;
  int iVar2;
  ImDrawListSharedData *pIVar3;
  ImDrawCmd *__src;
  unsigned_short *__src_00;
  ImDrawVert *__src_01;
  ImDrawList *pIVar4;
  ImDrawCmd *__dest;
  unsigned_short *puVar5;
  ImDrawVert *pIVar6;
  int iVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar10 [32];
  
  pIVar4 = (ImDrawList *)ImGui::MemAlloc(200);
  pIVar3 = this->_Data;
  auVar10 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar9 = auVar10._0_16_;
  (pIVar4->VtxBuffer).Size = auVar9._0_4_;
  (pIVar4->VtxBuffer).Capacity = auVar9._4_4_;
  (pIVar4->VtxBuffer).Data = (ImDrawVert *)auVar9._8_8_;
  pIVar4->Flags = auVar10._16_4_;
  pIVar4->_VtxCurrentIdx = auVar10._20_4_;
  pIVar4->_Data = (ImDrawListSharedData *)auVar10._24_8_;
  auVar9 = auVar10._0_16_;
  auVar11 = auVar10._16_16_;
  (pIVar4->CmdBuffer).Size = auVar9._0_4_;
  (pIVar4->CmdBuffer).Capacity = auVar9._4_4_;
  (pIVar4->CmdBuffer).Data = (ImDrawCmd *)auVar9._8_8_;
  (pIVar4->IdxBuffer).Size = auVar11._0_4_;
  (pIVar4->IdxBuffer).Capacity = auVar11._4_4_;
  (pIVar4->IdxBuffer).Data = (unsigned_short *)auVar11._8_8_;
  auVar10 = ZEXT1632(ZEXT816(0) << 0x40);
  pIVar4->_OwnerName = (char *)auVar10._0_8_;
  pIVar4->_VtxWritePtr = (ImDrawVert *)auVar10._8_8_;
  pIVar4->_IdxWritePtr = (ImDrawIdx *)auVar10._16_8_;
  (pIVar4->_ClipRectStack).Size = auVar10._24_4_;
  (pIVar4->_ClipRectStack).Capacity = auVar10._28_4_;
  *(undefined1 (*) [32])&(pIVar4->_ClipRectStack).Data = auVar10;
  *(undefined1 (*) [32])&(pIVar4->_Path).Data = auVar10;
  *(undefined1 (*) [32])&(pIVar4->_CmdHeader).VtxOffset = auVar10;
  *(undefined8 *)&pIVar4->_FringeScale = 0;
  pIVar4->_Data = pIVar3;
  uVar1 = (this->CmdBuffer).Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (ImDrawCmd *)0x0;
  }
  else {
    uVar8 = 8;
    if (8 < uVar1) {
      uVar8 = (ulong)uVar1;
    }
    __dest = (ImDrawCmd *)ImGui::MemAlloc(uVar8 * 0x38);
    __src = (pIVar4->CmdBuffer).Data;
    if (__src != (ImDrawCmd *)0x0) {
      memcpy(__dest,__src,(long)(pIVar4->CmdBuffer).Size * 0x38);
      ImGui::MemFree((pIVar4->CmdBuffer).Data);
    }
    (pIVar4->CmdBuffer).Data = __dest;
    (pIVar4->CmdBuffer).Capacity = (int)uVar8;
  }
  (pIVar4->CmdBuffer).Size = uVar1;
  memcpy(__dest,(this->CmdBuffer).Data,(long)(int)uVar1 * 0x38);
  puVar5 = (pIVar4->IdxBuffer).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (pIVar4->IdxBuffer).Size = 0;
    (pIVar4->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar5);
    (pIVar4->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  iVar2 = (this->IdxBuffer).Size;
  iVar7 = (pIVar4->IdxBuffer).Capacity;
  if (iVar7 < iVar2) {
    if (iVar7 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar7 / 2 + iVar7;
    }
    if (iVar7 <= iVar2) {
      iVar7 = iVar2;
    }
    puVar5 = (unsigned_short *)ImGui::MemAlloc((long)iVar7 * 2);
    __src_00 = (pIVar4->IdxBuffer).Data;
    if (__src_00 != (unsigned_short *)0x0) {
      memcpy(puVar5,__src_00,(long)(pIVar4->IdxBuffer).Size * 2);
      ImGui::MemFree((pIVar4->IdxBuffer).Data);
    }
    (pIVar4->IdxBuffer).Data = puVar5;
    (pIVar4->IdxBuffer).Capacity = iVar7;
  }
  else {
    puVar5 = (unsigned_short *)0x0;
  }
  (pIVar4->IdxBuffer).Size = iVar2;
  memcpy(puVar5,(this->IdxBuffer).Data,(long)iVar2 * 2);
  pIVar6 = (pIVar4->VtxBuffer).Data;
  if (pIVar6 != (ImDrawVert *)0x0) {
    (pIVar4->VtxBuffer).Size = 0;
    (pIVar4->VtxBuffer).Capacity = 0;
    ImGui::MemFree(pIVar6);
    (pIVar4->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  iVar2 = (this->VtxBuffer).Size;
  iVar7 = (pIVar4->VtxBuffer).Capacity;
  if (iVar7 < iVar2) {
    if (iVar7 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar7 / 2 + iVar7;
    }
    if (iVar7 <= iVar2) {
      iVar7 = iVar2;
    }
    pIVar6 = (ImDrawVert *)ImGui::MemAlloc((long)iVar7 * 0x14);
    __src_01 = (pIVar4->VtxBuffer).Data;
    if (__src_01 != (ImDrawVert *)0x0) {
      memcpy(pIVar6,__src_01,(long)(pIVar4->VtxBuffer).Size * 0x14);
      ImGui::MemFree((pIVar4->VtxBuffer).Data);
    }
    (pIVar4->VtxBuffer).Data = pIVar6;
    (pIVar4->VtxBuffer).Capacity = iVar7;
  }
  else {
    pIVar6 = (ImDrawVert *)0x0;
  }
  (pIVar4->VtxBuffer).Size = iVar2;
  memcpy(pIVar6,(this->VtxBuffer).Data,(long)iVar2 * 0x14);
  pIVar4->Flags = this->Flags;
  return pIVar4;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}